

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall EntryBTree::equalKeyCompareOp(EntryBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  uint8_t *local_20;
  
  bVar1 = *data;
  local_20 = data + 1;
  uVar3 = decodeBitsAndAdvance(&local_20);
  uVar4 = 0xffffffff;
  if ((uint)uVar3 <= key->m_nameIndex) {
    if ((uint)uVar3 < key->m_nameIndex) {
      uVar4 = 1;
    }
    else {
      if ((bVar1 & 2) == 0) {
        uVar4 = key->m_extIndex;
        uVar2 = 0;
      }
      else {
        uVar3 = decodeBitsAndAdvance(&local_20);
        uVar4 = key->m_extIndex;
        uVar2 = (uint)uVar3;
        if (uVar4 < uVar2) {
          return -1;
        }
      }
      uVar4 = (uint)(uVar2 < uVar4);
    }
  }
  return uVar4;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		
		const auto nameIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nameIndex() < nameIndex)
			return -1;
		else if (key.nameIndex() > nameIndex)
			return 1;
		
		const auto extIndex = (flags & EntryKey::FLAG_FILE) != 0 ? static_cast<uint32_t>(decodeBitsAndAdvance(data)) : 0;
		if (key.extIndex() < extIndex)
			return -1;
		else if (key.extIndex() > extIndex)
			return 1;
			
		return 0;
	}